

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  RTCIntersectArguments *pRVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_14a1;
  long local_14a0;
  float local_1498;
  int local_1494;
  Ray *local_1490;
  ulong local_1488;
  RayQueryContext *local_1480;
  RTCIntersectArguments *local_1478;
  Geometry *local_1470;
  long local_1468;
  ulong local_1460;
  ulong *local_1458;
  ulong local_1450;
  long local_1448;
  Scene *local_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  uint local_1420;
  uint local_141c;
  uint local_1418;
  RTCFilterFunctionNArguments local_1408;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8;
  byte local_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar55 = ray->tfar;
    if (0.0 <= fVar55) {
      local_1480 = context;
      local_1458 = local_11d8 + 1;
      aVar1 = (ray->dir).field_0;
      auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl((undefined1  [16])aVar1,auVar18);
      auVar19._8_4_ = 0x219392ef;
      auVar19._0_8_ = 0x219392ef219392ef;
      auVar19._12_4_ = 0x219392ef;
      uVar13 = vcmpps_avx512vl(auVar18,auVar19,1);
      auVar18 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar63 = ZEXT1664(auVar18);
      auVar18 = vdivps_avx512vl(auVar18,(undefined1  [16])aVar1);
      auVar19 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar2 = (bool)((byte)uVar13 & 1);
      auVar27._0_4_ = (uint)bVar2 * auVar19._0_4_ | (uint)!bVar2 * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar2 * auVar19._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar2 * auVar19._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      auVar20._8_4_ = 0x3f7ffffa;
      auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar20._12_4_ = 0x3f7ffffa;
      auVar20 = vmulps_avx512vl(auVar27,auVar20);
      auVar21._8_4_ = 0x3f800003;
      auVar21._0_8_ = 0x3f8000033f800003;
      auVar21._12_4_ = 0x3f800003;
      auVar21 = vmulps_avx512vl(auVar27,auVar21);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar64 = ZEXT3264(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar65 = ZEXT3264(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar66 = ZEXT3264(auVar40);
      auVar40 = vbroadcastss_avx512vl(auVar20);
      auVar67 = ZEXT3264(auVar40);
      auVar18 = vmovshdup_avx(auVar20);
      auVar40 = vbroadcastsd_avx512vl(auVar18);
      auVar68 = ZEXT3264(auVar40);
      auVar41._8_4_ = 2;
      auVar41._0_8_ = 0x200000002;
      auVar41._12_4_ = 2;
      auVar41._16_4_ = 2;
      auVar41._20_4_ = 2;
      auVar41._24_4_ = 2;
      auVar41._28_4_ = 2;
      auVar19 = vshufpd_avx(auVar20,auVar20,1);
      local_11f8 = vpermps_avx2(auVar41,ZEXT1632(auVar20));
      auVar54 = ZEXT3264(local_11f8);
      fVar45 = auVar21._0_4_;
      auVar40._8_4_ = 1;
      auVar40._0_8_ = 0x100000001;
      auVar40._12_4_ = 1;
      auVar40._16_4_ = 1;
      auVar40._20_4_ = 1;
      auVar40._24_4_ = 1;
      auVar40._28_4_ = 1;
      local_1238 = vpermps_avx2(auVar40,ZEXT1632(auVar21));
      auVar62 = ZEXT3264(local_1238);
      local_1258 = vpermps_avx2(auVar41,ZEXT1632(auVar21));
      auVar50 = ZEXT3264(local_1258);
      local_1460 = (ulong)(auVar20._0_4_ < 0.0) << 5;
      uVar15 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x40;
      uVar13 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x80;
      uVar16 = local_1460 ^ 0x20;
      uVar46 = auVar39._0_4_;
      local_1278._4_4_ = uVar46;
      local_1278._0_4_ = uVar46;
      local_1278._8_4_ = uVar46;
      local_1278._12_4_ = uVar46;
      local_1278._16_4_ = uVar46;
      local_1278._20_4_ = uVar46;
      local_1278._24_4_ = uVar46;
      local_1278._28_4_ = uVar46;
      auVar48 = ZEXT3264(local_1278);
      local_1298._4_4_ = fVar55;
      local_1298._0_4_ = fVar55;
      local_1298._8_4_ = fVar55;
      local_1298._12_4_ = fVar55;
      local_1298._16_4_ = fVar55;
      local_1298._20_4_ = fVar55;
      local_1298._24_4_ = fVar55;
      local_1298._28_4_ = fVar55;
      auVar52 = ZEXT3264(local_1298);
      local_1218 = fVar45;
      fStack_1214 = fVar45;
      fStack_1210 = fVar45;
      fStack_120c = fVar45;
      fStack_1208 = fVar45;
      fStack_1204 = fVar45;
      fStack_1200 = fVar45;
      fStack_11fc = fVar45;
      local_1490 = ray;
      fVar55 = fVar45;
      fVar56 = fVar45;
      fVar57 = fVar45;
      fVar58 = fVar45;
      fVar59 = fVar45;
      fVar60 = fVar45;
LAB_01c64710:
      if (local_1458 != local_11d8) {
        uVar17 = local_1458[-1];
        local_1458 = local_1458 + -1;
        do {
          uVar46 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 0xc);
          auVar44._4_4_ = uVar46;
          auVar44._0_4_ = uVar46;
          auVar44._8_4_ = uVar46;
          auVar44._12_4_ = uVar46;
          auVar44._16_4_ = uVar46;
          auVar44._20_4_ = uVar46;
          auVar44._24_4_ = uVar46;
          auVar44._28_4_ = uVar46;
          do {
            if ((uVar17 & 8) != 0) {
              local_1468 = (ulong)((uint)uVar17 & 0xf) - 8;
              uVar17 = uVar17 & 0xfffffffffffffff0;
              local_1448 = 0;
              goto LAB_01c648a7;
            }
            uVar10 = uVar17 & 0xfffffffffffffff0;
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + local_1460),auVar44,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + local_1460));
            auVar40 = vsubps_avx512vl(ZEXT1632(auVar39),auVar64._0_32_);
            auVar40 = vmulps_avx512vl(auVar67._0_32_,auVar40);
            auVar40 = vmaxps_avx(auVar48._0_32_,auVar40);
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar15),auVar44,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar15));
            auVar41 = vsubps_avx512vl(ZEXT1632(auVar39),auVar65._0_32_);
            auVar41 = vmulps_avx512vl(auVar68._0_32_,auVar41);
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar13),auVar44,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar13));
            auVar42 = vsubps_avx512vl(ZEXT1632(auVar39),auVar66._0_32_);
            auVar43._4_4_ = auVar54._4_4_ * auVar42._4_4_;
            auVar43._0_4_ = auVar54._0_4_ * auVar42._0_4_;
            auVar43._8_4_ = auVar54._8_4_ * auVar42._8_4_;
            auVar43._12_4_ = auVar54._12_4_ * auVar42._12_4_;
            auVar43._16_4_ = auVar54._16_4_ * auVar42._16_4_;
            auVar43._20_4_ = auVar54._20_4_ * auVar42._20_4_;
            auVar43._24_4_ = auVar54._24_4_ * auVar42._24_4_;
            auVar43._28_4_ = auVar42._28_4_;
            auVar41 = vmaxps_avx(auVar41,auVar43);
            auVar40 = vmaxps_avx(auVar40,auVar41);
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar16),auVar44,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar16));
            auVar41 = vsubps_avx512vl(ZEXT1632(auVar39),auVar64._0_32_);
            auVar42._4_4_ = fVar55 * auVar41._4_4_;
            auVar42._0_4_ = fVar45 * auVar41._0_4_;
            auVar42._8_4_ = fVar56 * auVar41._8_4_;
            auVar42._12_4_ = fVar57 * auVar41._12_4_;
            auVar42._16_4_ = fVar58 * auVar41._16_4_;
            auVar42._20_4_ = fVar59 * auVar41._20_4_;
            auVar42._24_4_ = fVar60 * auVar41._24_4_;
            auVar42._28_4_ = auVar41._28_4_;
            auVar41 = vminps_avx(auVar52._0_32_,auVar42);
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar15 ^ 0x20)),
                                      auVar44,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar15 ^ 0x20)));
            auVar43 = vsubps_avx512vl(ZEXT1632(auVar39),auVar65._0_32_);
            auVar8._4_4_ = auVar62._4_4_ * auVar43._4_4_;
            auVar8._0_4_ = auVar62._0_4_ * auVar43._0_4_;
            auVar8._8_4_ = auVar62._8_4_ * auVar43._8_4_;
            auVar8._12_4_ = auVar62._12_4_ * auVar43._12_4_;
            auVar8._16_4_ = auVar62._16_4_ * auVar43._16_4_;
            auVar8._20_4_ = auVar62._20_4_ * auVar43._20_4_;
            auVar8._24_4_ = auVar62._24_4_ * auVar43._24_4_;
            auVar8._28_4_ = auVar43._28_4_;
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar13 ^ 0x20)),
                                      auVar44,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar13 ^ 0x20)));
            auVar43 = vsubps_avx512vl(ZEXT1632(auVar39),auVar66._0_32_);
            auVar9._4_4_ = auVar50._4_4_ * auVar43._4_4_;
            auVar9._0_4_ = auVar50._0_4_ * auVar43._0_4_;
            auVar9._8_4_ = auVar50._8_4_ * auVar43._8_4_;
            auVar9._12_4_ = auVar50._12_4_ * auVar43._12_4_;
            auVar9._16_4_ = auVar50._16_4_ * auVar43._16_4_;
            auVar9._20_4_ = auVar50._20_4_ * auVar43._20_4_;
            auVar9._24_4_ = auVar50._24_4_ * auVar43._24_4_;
            auVar9._28_4_ = auVar43._28_4_;
            auVar43 = vminps_avx(auVar8,auVar9);
            auVar41 = vminps_avx(auVar41,auVar43);
            if (((uint)uVar17 & 7) == 6) {
              uVar4 = vcmpps_avx512vl(auVar40,auVar41,2);
              uVar5 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar10 + 0x1c0),0xd);
              uVar6 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
              uVar11 = (uint)uVar4 & (uint)uVar5 & (uint)uVar6;
            }
            else {
              uVar4 = vcmpps_avx512vl(auVar40,auVar41,2);
              uVar11 = (uint)uVar4;
            }
            if ((byte)uVar11 == 0) goto LAB_01c64710;
            lVar7 = 0;
            for (uVar17 = (ulong)(byte)uVar11; (uVar17 & 1) == 0;
                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar17 = *(ulong *)(uVar10 + lVar7 * 8);
            uVar11 = (uVar11 & 0xff) - 1 & uVar11 & 0xff;
            uVar12 = (ulong)uVar11;
          } while (uVar11 == 0);
          do {
            *local_1458 = uVar17;
            local_1458 = local_1458 + 1;
            lVar7 = 0;
            for (uVar17 = uVar12; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar12 = uVar12 - 1 & uVar12;
            uVar17 = *(ulong *)(uVar10 + lVar7 * 8);
          } while (uVar12 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_01c648a7:
  if (local_1448 == local_1468) goto LAB_01c64710;
  local_14a0 = local_1448 * 0x140;
  uVar46 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 0xc);
  auVar30._4_4_ = uVar46;
  auVar30._0_4_ = uVar46;
  auVar30._8_4_ = uVar46;
  auVar30._12_4_ = uVar46;
  auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x90 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + local_14a0));
  auVar18 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xa0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x10 + local_14a0));
  auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xb0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x20 + local_14a0));
  auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xc0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x30 + local_14a0));
  auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xd0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x40 + local_14a0));
  auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xe0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x50 + local_14a0));
  auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xf0 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x60 + local_14a0));
  auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x100 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x70 + local_14a0));
  auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x110 + local_14a0),auVar30,
                            *(undefined1 (*) [16])(uVar17 + 0x80 + local_14a0));
  uVar46 = *(undefined4 *)&(local_1490->org).field_0;
  auVar31._4_4_ = uVar46;
  auVar31._0_4_ = uVar46;
  auVar31._8_4_ = uVar46;
  auVar31._12_4_ = uVar46;
  auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1490->org).field_0.m128[1]));
  auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1490->org).field_0.m128[2]));
  uVar46 = *(undefined4 *)&(local_1490->dir).field_0;
  auVar49._4_4_ = uVar46;
  auVar49._0_4_ = uVar46;
  auVar49._8_4_ = uVar46;
  auVar49._12_4_ = uVar46;
  uVar46 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 4);
  auVar53._4_4_ = uVar46;
  auVar53._0_4_ = uVar46;
  auVar53._8_4_ = uVar46;
  auVar53._12_4_ = uVar46;
  fVar55 = (local_1490->dir).field_0.m128[2];
  auVar61._4_4_ = fVar55;
  auVar61._0_4_ = fVar55;
  auVar61._8_4_ = fVar55;
  auVar61._12_4_ = fVar55;
  auVar39 = vsubps_avx(auVar39,auVar31);
  auVar24 = vsubps_avx512vl(auVar18,auVar22);
  auVar25 = vsubps_avx512vl(auVar19,auVar23);
  auVar26 = vsubps_avx512vl(auVar20,auVar31);
  auVar21 = vsubps_avx512vl(auVar21,auVar22);
  auVar27 = vsubps_avx512vl(auVar27,auVar23);
  auVar28 = vsubps_avx512vl(auVar28,auVar31);
  auVar29 = vsubps_avx512vl(auVar29,auVar22);
  auVar30 = vsubps_avx512vl(auVar30,auVar23);
  auVar22 = vsubps_avx512vl(auVar28,auVar39);
  auVar18 = vsubps_avx(auVar29,auVar24);
  auVar19 = vsubps_avx(auVar30,auVar25);
  auVar23 = vsubps_avx512vl(auVar39,auVar26);
  auVar31 = vsubps_avx512vl(auVar24,auVar21);
  auVar32 = vsubps_avx512vl(auVar25,auVar27);
  auVar33 = vsubps_avx512vl(auVar26,auVar28);
  auVar34 = vsubps_avx512vl(auVar21,auVar29);
  auVar35 = vsubps_avx512vl(auVar27,auVar30);
  auVar20 = vaddps_avx512vl(auVar28,auVar39);
  auVar51._0_4_ = auVar29._0_4_ + auVar24._0_4_;
  auVar51._4_4_ = auVar29._4_4_ + auVar24._4_4_;
  auVar51._8_4_ = auVar29._8_4_ + auVar24._8_4_;
  auVar51._12_4_ = auVar29._12_4_ + auVar24._12_4_;
  auVar36 = vaddps_avx512vl(auVar30,auVar25);
  auVar37 = vmulps_avx512vl(auVar51,auVar19);
  auVar37 = vfmsub231ps_avx512vl(auVar37,auVar18,auVar36);
  auVar36 = vmulps_avx512vl(auVar36,auVar22);
  auVar36 = vfmsub231ps_avx512vl(auVar36,auVar19,auVar20);
  auVar38._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar38._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar38._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar38._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar20 = vfmsub231ps_fma(auVar38,auVar22,auVar51);
  auVar47._0_4_ = fVar55 * auVar20._0_4_;
  auVar47._4_4_ = fVar55 * auVar20._4_4_;
  auVar47._8_4_ = fVar55 * auVar20._8_4_;
  auVar47._12_4_ = fVar55 * auVar20._12_4_;
  auVar20 = vfmadd231ps_avx512vl(auVar47,auVar53,auVar36);
  local_13d8 = vfmadd231ps_avx512vl(auVar20,auVar49,auVar37);
  auVar20 = vaddps_avx512vl(auVar39,auVar26);
  auVar36 = vaddps_avx512vl(auVar24,auVar21);
  auVar37 = vaddps_avx512vl(auVar25,auVar27);
  auVar38 = vmulps_avx512vl(auVar36,auVar32);
  auVar38 = vfmsub231ps_avx512vl(auVar38,auVar31,auVar37);
  auVar37 = vmulps_avx512vl(auVar37,auVar23);
  auVar37 = vfmsub231ps_avx512vl(auVar37,auVar32,auVar20);
  auVar20 = vmulps_avx512vl(auVar20,auVar31);
  auVar20 = vfmsub231ps_avx512vl(auVar20,auVar23,auVar36);
  auVar36._0_4_ = fVar55 * auVar20._0_4_;
  auVar36._4_4_ = fVar55 * auVar20._4_4_;
  auVar36._8_4_ = fVar55 * auVar20._8_4_;
  auVar36._12_4_ = fVar55 * auVar20._12_4_;
  auVar20 = vfmadd231ps_avx512vl(auVar36,auVar53,auVar37);
  local_13c8 = vfmadd231ps_avx512vl(auVar20,auVar49,auVar38);
  auVar20 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar28 = vaddps_avx512vl(auVar26,auVar28);
  auVar21 = vaddps_avx512vl(auVar21,auVar29);
  auVar27 = vaddps_avx512vl(auVar27,auVar30);
  auVar29 = vmulps_avx512vl(auVar21,auVar35);
  auVar29 = vfmsub231ps_avx512vl(auVar29,auVar34,auVar27);
  auVar37._0_4_ = auVar27._0_4_ * auVar33._0_4_;
  auVar37._4_4_ = auVar27._4_4_ * auVar33._4_4_;
  auVar37._8_4_ = auVar27._8_4_ * auVar33._8_4_;
  auVar37._12_4_ = auVar27._12_4_ * auVar33._12_4_;
  auVar27 = vfmsub231ps_avx512vl(auVar37,auVar35,auVar28);
  auVar28 = vmulps_avx512vl(auVar28,auVar34);
  auVar21 = vfmsub231ps_avx512vl(auVar28,auVar33,auVar21);
  auVar21 = vmulps_avx512vl(auVar61,auVar21);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar53,auVar27);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar49,auVar29);
  auVar26._0_4_ = local_13d8._0_4_ + local_13c8._0_4_;
  auVar26._4_4_ = local_13d8._4_4_ + local_13c8._4_4_;
  auVar26._8_4_ = local_13d8._8_4_ + local_13c8._8_4_;
  auVar26._12_4_ = local_13d8._12_4_ + local_13c8._12_4_;
  local_13b8 = vaddps_avx512vl(auVar21,auVar26);
  auVar27 = vandps_avx512vl(local_13b8,auVar20);
  auVar28._8_4_ = 0x34000000;
  auVar28._0_8_ = 0x3400000034000000;
  auVar28._12_4_ = 0x34000000;
  auVar28 = vmulps_avx512vl(auVar27,auVar28);
  auVar29 = vminps_avx512vl(local_13d8,local_13c8);
  auVar30 = vminps_avx512vl(auVar29,auVar21);
  auVar29._8_4_ = 0x80000000;
  auVar29._0_8_ = 0x8000000080000000;
  auVar29._12_4_ = 0x80000000;
  auVar29 = vxorps_avx512vl(auVar28,auVar29);
  uVar4 = vcmpps_avx512vl(auVar30,auVar29,5);
  auVar29 = vmaxps_avx512vl(local_13d8,local_13c8);
  auVar21 = vmaxps_avx512vl(auVar29,auVar21);
  uVar5 = vcmpps_avx512vl(auVar21,auVar28,2);
  local_13a0 = ((byte)uVar4 | (byte)uVar5) & 0xf;
  if (local_13a0 != 0) {
    auVar21 = vmulps_avx512vl(auVar19,auVar31);
    auVar28 = vmulps_avx512vl(auVar22,auVar32);
    auVar29 = vmulps_avx512vl(auVar18,auVar23);
    auVar30 = vmulps_avx512vl(auVar32,auVar34);
    auVar26 = vmulps_avx512vl(auVar23,auVar35);
    auVar36 = vmulps_avx512vl(auVar31,auVar33);
    auVar18 = vfmsub213ps_avx512vl(auVar18,auVar32,auVar21);
    auVar19 = vfmsub213ps_avx512vl(auVar19,auVar23,auVar28);
    auVar22 = vfmsub213ps_avx512vl(auVar22,auVar31,auVar29);
    auVar31 = vfmsub213ps_avx512vl(auVar35,auVar31,auVar30);
    auVar32 = vfmsub213ps_avx512vl(auVar33,auVar32,auVar26);
    auVar23 = vfmsub213ps_avx512vl(auVar34,auVar23,auVar36);
    auVar21 = vandps_avx512vl(auVar21,auVar20);
    auVar30 = vandps_avx512vl(auVar30,auVar20);
    uVar10 = vcmpps_avx512vl(auVar21,auVar30,1);
    auVar21 = vandps_avx512vl(auVar28,auVar20);
    auVar28 = vandps_avx512vl(auVar26,auVar20);
    uVar12 = vcmpps_avx512vl(auVar21,auVar28,1);
    auVar21 = vandps_avx512vl(auVar29,auVar20);
    auVar20 = vandps_avx512vl(auVar36,auVar20);
    uVar3 = vcmpps_avx512vl(auVar21,auVar20,1);
    bVar2 = (bool)((byte)uVar10 & 1);
    local_1368._0_4_ = (uint)bVar2 * auVar18._0_4_ | (uint)!bVar2 * auVar31._0_4_;
    bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
    local_1368._4_4_ = (uint)bVar2 * auVar18._4_4_ | (uint)!bVar2 * auVar31._4_4_;
    bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
    local_1368._8_4_ = (uint)bVar2 * auVar18._8_4_ | (uint)!bVar2 * auVar31._8_4_;
    bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
    local_1368._12_4_ = (uint)bVar2 * auVar18._12_4_ | (uint)!bVar2 * auVar31._12_4_;
    bVar2 = (bool)((byte)uVar12 & 1);
    local_1358._0_4_ = (uint)bVar2 * auVar19._0_4_ | (uint)!bVar2 * auVar32._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    local_1358._4_4_ = (uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * auVar32._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    local_1358._8_4_ = (uint)bVar2 * auVar19._8_4_ | (uint)!bVar2 * auVar32._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    local_1358._12_4_ = (uint)bVar2 * auVar19._12_4_ | (uint)!bVar2 * auVar32._12_4_;
    bVar2 = (bool)((byte)uVar3 & 1);
    local_1348._0_4_ = (float)((uint)bVar2 * auVar22._0_4_ | (uint)!bVar2 * auVar23._0_4_);
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    local_1348._4_4_ = (float)((uint)bVar2 * auVar22._4_4_ | (uint)!bVar2 * auVar23._4_4_);
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    local_1348._8_4_ = (float)((uint)bVar2 * auVar22._8_4_ | (uint)!bVar2 * auVar23._8_4_);
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    local_1348._12_4_ = (float)((uint)bVar2 * auVar22._12_4_ | (uint)!bVar2 * auVar23._12_4_);
    auVar34._0_4_ = fVar55 * local_1348._0_4_;
    auVar34._4_4_ = fVar55 * local_1348._4_4_;
    auVar34._8_4_ = fVar55 * local_1348._8_4_;
    auVar34._12_4_ = fVar55 * local_1348._12_4_;
    auVar18 = vfmadd213ps_fma(auVar53,local_1358,auVar34);
    auVar18 = vfmadd213ps_fma(auVar49,local_1368,auVar18);
    auVar32._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    auVar32._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    auVar32._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    auVar32._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    auVar33._0_4_ = auVar25._0_4_ * local_1348._0_4_;
    auVar33._4_4_ = auVar25._4_4_ * local_1348._4_4_;
    auVar33._8_4_ = auVar25._8_4_ * local_1348._8_4_;
    auVar33._12_4_ = auVar25._12_4_ * local_1348._12_4_;
    auVar18 = vfmadd213ps_fma(auVar24,local_1358,auVar33);
    auVar18 = vfmadd213ps_fma(auVar39,local_1368,auVar18);
    auVar39 = vrcp14ps_avx512vl(auVar32);
    auVar20 = auVar63._0_16_;
    auVar19 = vfnmadd213ps_avx512vl(auVar39,auVar32,auVar20);
    auVar39 = vfmadd132ps_fma(auVar19,auVar39,auVar39);
    local_1378._0_4_ = auVar39._0_4_ * (auVar18._0_4_ + auVar18._0_4_);
    local_1378._4_4_ = auVar39._4_4_ * (auVar18._4_4_ + auVar18._4_4_);
    local_1378._8_4_ = auVar39._8_4_ * (auVar18._8_4_ + auVar18._8_4_);
    local_1378._12_4_ = auVar39._12_4_ * (auVar18._12_4_ + auVar18._12_4_);
    uVar46 = *(undefined4 *)((long)&(local_1490->org).field_0 + 0xc);
    auVar39._4_4_ = uVar46;
    auVar39._0_4_ = uVar46;
    auVar39._8_4_ = uVar46;
    auVar39._12_4_ = uVar46;
    uVar4 = vcmpps_avx512vl(local_1378,auVar39,0xd);
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar39 = vxorps_avx512vl(auVar32,auVar22);
    fVar55 = local_1490->tfar;
    auVar23._4_4_ = fVar55;
    auVar23._0_4_ = fVar55;
    auVar23._8_4_ = fVar55;
    auVar23._12_4_ = fVar55;
    uVar5 = vcmpps_avx512vl(local_1378,auVar23,2);
    uVar6 = vcmpps_avx512vl(auVar32,auVar39,4);
    local_13a0 = (byte)uVar4 & (byte)uVar5 & (byte)uVar6 & local_13a0;
    if (local_13a0 != 0) {
      local_14a0 = local_14a0 + uVar17;
      local_13a8 = &local_14a1;
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar10 = vcmpps_avx512vl(auVar27,auVar24,5);
      auVar39 = vrcp14ps_avx512vl(local_13b8);
      auVar18 = vfnmadd213ps_avx512vl(local_13b8,auVar39,auVar20);
      auVar39 = vfmadd132ps_avx512vl(auVar18,auVar39,auVar39);
      fVar58 = (float)((uint)((byte)uVar10 & 1) * auVar39._0_4_);
      fVar57 = (float)((uint)((byte)(uVar10 >> 1) & 1) * auVar39._4_4_);
      fVar56 = (float)((uint)((byte)(uVar10 >> 2) & 1) * auVar39._8_4_);
      fVar55 = (float)((uint)((byte)(uVar10 >> 3) & 1) * auVar39._12_4_);
      auVar25._0_4_ = fVar58 * local_13d8._0_4_;
      auVar25._4_4_ = fVar57 * local_13d8._4_4_;
      auVar25._8_4_ = fVar56 * local_13d8._8_4_;
      auVar25._12_4_ = fVar55 * local_13d8._12_4_;
      local_1398 = vminps_avx512vl(auVar25,auVar20);
      auVar35._0_4_ = fVar58 * local_13c8._0_4_;
      auVar35._4_4_ = fVar57 * local_13c8._4_4_;
      auVar35._8_4_ = fVar56 * local_13c8._8_4_;
      auVar35._12_4_ = fVar55 * local_13c8._12_4_;
      local_1388 = vminps_avx512vl(auVar35,auVar20);
      local_1450 = (ulong)local_13a0;
      local_1440 = local_1480->scene;
      do {
        local_1488 = 0;
        for (uVar10 = local_1450; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          local_1488 = local_1488 + 1;
        }
        local_1420 = *(uint *)(local_14a0 + 0x120 + local_1488 * 4);
        local_1470 = (local_1440->geometries).items[local_1420].ptr;
        if ((local_1470->mask & local_1490->mask) == 0) {
          local_1450 = local_1450 ^ 1L << (local_1488 & 0x3f);
        }
        else {
          pRVar14 = local_1480->args;
          if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
             (local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c64fac:
            local_1490->tfar = -INFINITY;
            return;
          }
          local_1338 = auVar68._0_32_;
          local_1318 = auVar67._0_32_;
          local_12f8 = auVar66._0_32_;
          local_12d8 = auVar65._0_32_;
          local_12b8 = auVar64._0_32_;
          uVar10 = (ulong)(uint)((int)local_1488 * 4);
          local_1408.context = local_1480->user;
          local_1438 = *(undefined4 *)(local_1368 + uVar10);
          local_1434 = *(undefined4 *)(local_1358 + uVar10);
          local_1430 = *(undefined4 *)(local_1348 + uVar10);
          local_142c = *(undefined4 *)(local_1398 + uVar10);
          local_1428 = *(undefined4 *)(local_1388 + uVar10);
          local_1424 = *(undefined4 *)(local_14a0 + 0x130 + uVar10);
          local_141c = (local_1408.context)->instID[0];
          local_1418 = (local_1408.context)->instPrimID[0];
          local_1498 = local_1490->tfar;
          local_1490->tfar = *(float *)(local_1378 + uVar10);
          local_1494 = -1;
          local_1408.valid = &local_1494;
          local_1408.geometryUserPtr = local_1470->userPtr;
          local_1408.hit = (RTCHitN *)&local_1438;
          local_1408.N = 1;
          local_1408.ray = (RTCRayN *)local_1490;
          if (((local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
              (local_1478 = pRVar14, (*local_1470->occlusionFilterN)(&local_1408),
              pRVar14 = local_1478, *local_1408.valid != 0)) &&
             ((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
              ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_1470->field_8).field_0x2 & 0x40) == 0))
               || ((*pRVar14->filter)(&local_1408), *local_1408.valid != 0)))))) goto LAB_01c64fac;
          local_1490->tfar = local_1498;
          local_1450 = local_1450 ^ 1L << (local_1488 & 0x3f);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar63 = ZEXT1664(auVar39);
          auVar64 = ZEXT3264(local_12b8);
          auVar65 = ZEXT3264(local_12d8);
          auVar66 = ZEXT3264(local_12f8);
          auVar67 = ZEXT3264(local_1318);
          auVar68 = ZEXT3264(local_1338);
        }
      } while (local_1450 != 0);
    }
  }
  local_1448 = local_1448 + 1;
  auVar54 = ZEXT3264(local_11f8);
  auVar62 = ZEXT3264(local_1238);
  auVar50 = ZEXT3264(local_1258);
  auVar48 = ZEXT3264(local_1278);
  auVar52 = ZEXT3264(local_1298);
  fVar45 = local_1218;
  fVar55 = fStack_1214;
  fVar56 = fStack_1210;
  fVar57 = fStack_120c;
  fVar58 = fStack_1208;
  fVar59 = fStack_1204;
  fVar60 = fStack_1200;
  goto LAB_01c648a7;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }